

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void ExtractPalettedAlphaRows(VP8LDecoder *dec,int last_row)

{
  uint8_t *dst;
  ALPHDecoder *alph_dec_00;
  long lVar1;
  uint8_t *out_00;
  int in_ESI;
  long in_RDI;
  VP8LTransform *unaff_retaddr;
  VP8LTransform *transform;
  uint8_t *in;
  uint8_t *out;
  int width;
  int first_row;
  int top_row;
  ALPHDecoder *alph_dec;
  int local_48;
  int stride;
  undefined4 in_stack_fffffffffffffff0;
  
  dst = *(uint8_t **)(*(long *)(in_RDI + 8) + 0x38);
  if ((*(int *)(dst + 0xc) == 0) || (*(int *)(dst + 0xc) == 1)) {
    stride = *(int *)(*(long *)(in_RDI + 8) + 0x80);
  }
  else {
    stride = *(int *)(in_RDI + 0x8c);
  }
  local_48 = stride;
  if (stride <= *(int *)(in_RDI + 0x8c)) {
    local_48 = *(int *)(in_RDI + 0x8c);
  }
  if (local_48 < in_ESI) {
    alph_dec_00 = (ALPHDecoder *)(*(long *)(dst + 200) + (long)(**(int **)(in_RDI + 8) * local_48));
    lVar1 = *(long *)(in_RDI + 0x18) + (long)(*(int *)(in_RDI + 0x84) * local_48);
    out_00 = (uint8_t *)(in_RDI + 0xf8);
    VP8LColorIndexInverseTransformAlpha
              (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),dst);
    AlphaApplyFilter(alph_dec_00,(int)((ulong)lVar1 >> 0x20),(int)lVar1,out_00,stride);
  }
  *(int *)(in_RDI + 0x94) = in_ESI;
  *(int *)(in_RDI + 0x8c) = in_ESI;
  return;
}

Assistant:

static void ExtractPalettedAlphaRows(VP8LDecoder* const dec, int last_row) {
  // For vertical and gradient filtering, we need to decode the part above the
  // crop_top row, in order to have the correct spatial predictors.
  ALPHDecoder* const alph_dec = (ALPHDecoder*)dec->io_->opaque;
  const int top_row =
      (alph_dec->filter_ == WEBP_FILTER_NONE ||
       alph_dec->filter_ == WEBP_FILTER_HORIZONTAL) ? dec->io_->crop_top
                                                    : dec->last_row_;
  const int first_row = (dec->last_row_ < top_row) ? top_row : dec->last_row_;
  assert(last_row <= dec->io_->crop_bottom);
  if (last_row > first_row) {
    // Special method for paletted alpha data. We only process the cropped area.
    const int width = dec->io_->width;
    uint8_t* out = alph_dec->output_ + width * first_row;
    const uint8_t* const in =
      (uint8_t*)dec->pixels_ + dec->width_ * first_row;
    VP8LTransform* const transform = &dec->transforms_[0];
    assert(dec->next_transform_ == 1);
    assert(transform->type_ == COLOR_INDEXING_TRANSFORM);
    VP8LColorIndexInverseTransformAlpha(transform, first_row, last_row,
                                        in, out);
    AlphaApplyFilter(alph_dec, first_row, last_row, out, width);
  }
  dec->last_row_ = dec->last_out_row_ = last_row;
}